

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O2

IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
* __thiscall
linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>::Take
          (IEnumerableCore<linq::TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>_>
           *__return_storage_ptr__,
          IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_> *this
          ,size_t count)

{
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&> TStack_58;
  
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::TakeState
            (&TStack_58,&this->source,count);
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::TakeState
            (&__return_storage_ptr__->source,&TStack_58);
  TakeState<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>,_int_&>::~TakeState
            (&TStack_58);
  return __return_storage_ptr__;
}

Assistant:

auto Take(size_t count) 
		{ 
			return IEnumerableCore<TakeState<S, T>>(
				TakeState<S, T>(std::move(source), count)
			);
		}